

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

Result __thiscall
wabt::interp::Instance::CallInitFunc
          (Instance *this,Store *store,Ref func_ref,Value *result,Ptr *out_trap)

{
  undefined8 uVar1;
  Result RVar2;
  Enum EVar3;
  Values results;
  Ptr func;
  _Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_48;
  
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RefPtr<wabt::interp::Func>::RefPtr(&func,store,func_ref);
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RVar2 = Func::Call(func.obj_,store,(Values *)&local_48,&results,out_trap,(Stream *)0x0);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&local_48);
  if (RVar2.enum_ == Error) {
    EVar3 = Error;
  }
  else {
    if ((long)results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
              _M_impl.super__Vector_impl_data._M_finish -
        (long)results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
              _M_impl.super__Vector_impl_data._M_start != 0x10) {
      __assert_fail("results.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/interp/interp.cc"
                    ,0x2aa,
                    "Result wabt::interp::Instance::CallInitFunc(Store &, const Ref, Value *, Trap::Ptr *)"
                   );
    }
    uVar1 = *(undefined8 *)
             ((long)&(results.
                      super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                      _M_impl.super__Vector_impl_data._M_start)->field_0 + 8);
    (result->field_0).i64_ =
         ((results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
           _M_impl.super__Vector_impl_data._M_start)->field_0).i64_;
    *(undefined8 *)((long)&result->field_0 + 8) = uVar1;
    EVar3 = Ok;
  }
  RefPtr<wabt::interp::Func>::reset(&func);
  std::_Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~_Vector_base
            (&results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>)
  ;
  return (Result)EVar3;
}

Assistant:

Result Instance::CallInitFunc(Store& store,
                              const Ref func_ref,
                              Value* result,
                              Trap::Ptr* out_trap) {
  Values results;
  Func::Ptr func{store, func_ref};
  if (Failed(func->Call(store, {}, results, out_trap))) {
    return Result::Error;
  }
  assert(results.size() == 1);
  *result = results[0];
  return Result::Ok;
}